

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgSmallDeterminant.cpp
# Opt level: O3

dgGoogol * Determinant3x3(dgGoogol *__return_storage_ptr__,dgGoogol (*matrix) [3])

{
  undefined8 *puVar1;
  dgGoogol *pdVar2;
  undefined8 uVar3;
  HaU64 HVar4;
  HaU64 HVar5;
  HaU64 HVar6;
  bool bVar7;
  bool bVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  dgGoogol sign;
  dgGoogol negOne;
  dgGoogol minorDet;
  dgGoogol cofactor [2] [2];
  dgGoogol local_1c8;
  dgGoogol local_1a0;
  dgGoogol local_178;
  dgGoogol local_150;
  dgGoogol local_128;
  dgGoogol local_100;
  dgGoogol local_d8 [4];
  
  dgGoogol::dgGoogol(&local_178,-1.0);
  dgGoogol::dgGoogol(&local_1c8,-1.0);
  dgGoogol::dgGoogol(__return_storage_ptr__,0.0);
  lVar13 = 0;
  lVar12 = 0;
  do {
    lVar11 = 0;
    do {
      dgGoogol::dgGoogol((dgGoogol *)((long)local_d8[0].m_mantissa + lVar11 + -8));
      lVar11 = lVar11 + 0x28;
    } while (lVar11 != 0xa0);
    lVar11 = 0;
    bVar7 = true;
    do {
      bVar8 = bVar7;
      lVar9 = 0;
      iVar10 = 0;
      do {
        if (lVar13 != lVar9) {
          local_d8[lVar11 * 2 + (long)iVar10].m_mantissa[3] =
               *(HaU64 *)((long)matrix[lVar11][0].m_mantissa + lVar9 + 0x18);
          puVar1 = (undefined8 *)((long)matrix[lVar11][0].m_mantissa + lVar9 + -8);
          uVar3 = *puVar1;
          HVar4 = puVar1[1];
          HVar5 = puVar1[2];
          HVar6 = puVar1[3];
          pdVar2 = local_d8 + lVar11 * 2 + (long)iVar10;
          pdVar2->m_sign = (char)uVar3;
          pdVar2->field_0x1 = (char)((ulong)uVar3 >> 8);
          pdVar2->m_exponent = (short)((ulong)uVar3 >> 0x10);
          *(int *)&pdVar2->field_0x4 = (int)((ulong)uVar3 >> 0x20);
          pdVar2->m_mantissa[0] = HVar4;
          pdVar2->m_mantissa[1] = HVar5;
          pdVar2->m_mantissa[2] = HVar6;
          iVar10 = iVar10 + 1;
        }
        lVar9 = lVar9 + 0x28;
      } while (lVar9 != 0x78);
      lVar11 = 1;
      bVar7 = false;
    } while (bVar8);
    Determinant2x2(&local_128,(dgGoogol (*) [2])local_d8);
    dgGoogol::operator*(&local_150,&local_1c8,&local_128);
    dgGoogol::operator*(&local_100,&local_150,matrix[2] + lVar12);
    dgGoogol::operator+(&local_1a0,__return_storage_ptr__,&local_100);
    __return_storage_ptr__->m_mantissa[3] = local_1a0.m_mantissa[3];
    __return_storage_ptr__->m_sign = local_1a0.m_sign;
    __return_storage_ptr__->field_0x1 = local_1a0._1_1_;
    __return_storage_ptr__->m_exponent = local_1a0.m_exponent;
    *(undefined4 *)&__return_storage_ptr__->field_0x4 = local_1a0._4_4_;
    __return_storage_ptr__->m_mantissa[0] = local_1a0.m_mantissa[0];
    __return_storage_ptr__->m_mantissa[1] = local_1a0.m_mantissa[1];
    __return_storage_ptr__->m_mantissa[2] = local_1a0.m_mantissa[2];
    dgGoogol::~dgGoogol(&local_1a0);
    dgGoogol::~dgGoogol(&local_100);
    dgGoogol::~dgGoogol(&local_150);
    dgGoogol::operator*(&local_1a0,&local_1c8,&local_178);
    local_1c8.m_mantissa[3] = local_1a0.m_mantissa[3];
    local_1c8.m_sign = local_1a0.m_sign;
    local_1c8._1_1_ = local_1a0._1_1_;
    local_1c8.m_exponent = local_1a0.m_exponent;
    local_1c8._4_4_ = local_1a0._4_4_;
    local_1c8.m_mantissa[0] = local_1a0.m_mantissa[0];
    local_1c8.m_mantissa[1] = local_1a0.m_mantissa[1];
    local_1c8.m_mantissa[2] = local_1a0.m_mantissa[2];
    dgGoogol::~dgGoogol(&local_1a0);
    dgGoogol::~dgGoogol(&local_128);
    lVar11 = 0x78;
    do {
      dgGoogol::~dgGoogol((dgGoogol *)((long)local_d8[0].m_mantissa + lVar11 + -8));
      lVar11 = lVar11 + -0x28;
    } while (lVar11 != -0x28);
    lVar12 = lVar12 + 1;
    lVar13 = lVar13 + 0x28;
  } while (lVar12 != 3);
  dgGoogol::~dgGoogol(&local_1c8);
  dgGoogol::~dgGoogol(&local_178);
  return __return_storage_ptr__;
}

Assistant:

dgGoogol Determinant3x3 (const dgGoogol matrix[3][3])
{
	dgGoogol negOne (hacd::HaF64 (-1.0f));
	dgGoogol sign (hacd::HaF64 (-1.0f));
	dgGoogol det = hacd::HaF64 (0.0f);
	for (hacd::HaI32 i = 0; i < 3; i ++)  {
		dgGoogol cofactor[2][2];

		for (hacd::HaI32 j = 0; j < 2; j ++) {
			hacd::HaI32 k0 = 0;
			for (hacd::HaI32 k = 0; k < 3; k ++) {
				if (k != i) {
					cofactor[j][k0] = matrix[j][k];
					k0 ++;
				}
			}
		}

		dgGoogol minorDet (Determinant2x2 (cofactor));
		det = det + sign * minorDet * matrix[2][i];
		sign = sign * negOne;
	}
	return det;
}